

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O0

DiyFp __thiscall czh::utils::DiyFp::operator*(DiyFp *this,DiyFp *x)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  DiyFp DVar7;
  uint64_t M32;
  uint64_t tmp;
  uint64_t bd;
  uint64_t ad;
  uint64_t bc;
  uint64_t ac;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  DiyFp *x_local;
  DiyFp *this_local;
  undefined4 local_10;
  
  uVar1 = (ulong)*(uint *)((long)&this->f + 4);
  uVar2 = this->f & 0xffffffff;
  uVar3 = (ulong)*(uint *)((long)&x->f + 4);
  uVar4 = x->f & 0xffffffff;
  uVar5 = uVar2 * uVar3;
  uVar6 = uVar1 * uVar4;
  DiyFp((DiyFp *)&this_local,
        uVar1 * uVar3 + (uVar6 >> 0x20) + (uVar5 >> 0x20) +
        ((uVar2 * uVar4 >> 0x20) + (uVar6 & 0xffffffff) + (uVar5 & 0xffffffff) + 0x80000000 >> 0x20)
        ,this->e + 0x40 + x->e);
  DVar7._12_4_ = 0;
  DVar7.f = (uint64_t)this_local;
  DVar7.e = local_10;
  return DVar7;
}

Assistant:

DiyFp operator*(const DiyFp &x) const
    {
      uint64_t a, b, c, d, ac, bc, ad, bd, tmp;
      uint64_t M32 = 0xFFFFFFFF;
      a = f >> 32;
      b = f & M32;
      c = x.f >> 32;
      d = x.f & M32;
      ac = a * c;
      bc = b * c;
      ad = a * d;
      bd = b * d;
      tmp = (bd >> 32) + (ad & M32) + (bc & M32);
      tmp += 1U << 31;
      return {ac + (ad >> 32) + (bc >> 32) + (tmp >> 32), e + x.e + 64};
    }